

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O2

string * wasm::read_possible_response_file(string *__return_storage_ptr__,string *input)

{
  BinaryOption binary;
  wasm local_38 [32];
  
  if ((input->_M_string_length == 0) || (*(input->_M_dataplus)._M_p != '@')) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)input);
  }
  else {
    binary = ~Binary;
    std::__cxx11::string::substr((ulong)local_38,(ulong)input);
    read_file<std::__cxx11::string>(__return_storage_ptr__,local_38,(string *)0x1,binary);
    std::__cxx11::string::~string((string *)local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string wasm::read_possible_response_file(const std::string& input) {
  if (input.size() == 0 || input[0] != '@') {
    return input;
  }
  return wasm::read_file<std::string>(input.substr(1), Flags::Text);
}